

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O0

int cmdline_parser_dump(FILE *outfile,gengetopt_args_info *args_info)

{
  char *in_RSI;
  FILE *in_RDI;
  char *unaff_retaddr;
  int i;
  char **in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  undefined4 uVar1;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  uVar1 = 0;
  if (in_RDI == (FILE *)0x0) {
    fprintf(_stderr,"%s: cannot dump options to stream\n","nanorod_pentBuilder");
    iVar2 = 1;
  }
  else {
    if (*(int *)(in_RSI + 0xf8) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)(ulong)in_stack_ffffffffffffffe0,
                      in_stack_ffffffffffffffd8);
    }
    if (*(int *)(in_RSI + 0xfc) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    if (*(int *)(in_RSI + 0x100) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    if (*(int *)(in_RSI + 0x104) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    if (*(int *)(in_RSI + 0x108) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    if (*(int *)(in_RSI + 0x10c) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    write_multiple_into_file
              ((FILE *)args_info,i,unaff_retaddr,
               (char **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (char **)in_RDI);
    write_multiple_into_file
              ((FILE *)args_info,i,unaff_retaddr,
               (char **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (char **)in_RDI);
    if (*(int *)(in_RSI + 0x118) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    if (*(int *)(in_RSI + 0x11c) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    if (*(int *)(in_RSI + 0x120) != 0) {
      write_into_file(in_RDI,in_RSI,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
cmdline_parser_dump(FILE *outfile, struct gengetopt_args_info *args_info)
{
  int i = 0;

  if (!outfile)
    {
      fprintf (stderr, "%s: cannot dump options to stream\n", CMDLINE_PARSER_PACKAGE);
      return EXIT_FAILURE;
    }

  if (args_info->help_given)
    write_into_file(outfile, "help", 0, 0 );
  if (args_info->version_given)
    write_into_file(outfile, "version", 0, 0 );
  if (args_info->output_given)
    write_into_file(outfile, "output", args_info->output_orig, 0);
  if (args_info->latticeConstant_given)
    write_into_file(outfile, "latticeConstant", args_info->latticeConstant_orig, 0);
  if (args_info->radius_given)
    write_into_file(outfile, "radius", args_info->radius_orig, 0);
  if (args_info->length_given)
    write_into_file(outfile, "length", args_info->length_orig, 0);
  write_multiple_into_file(outfile, args_info->shellRadius_given, "shellRadius", args_info->shellRadius_orig, 0);
  write_multiple_into_file(outfile, args_info->molFraction_given, "molFraction", args_info->molFraction_orig, 0);
  if (args_info->vacancyPercent_given)
    write_into_file(outfile, "vacancyPercent", args_info->vacancyPercent_orig, 0);
  if (args_info->vacancyInnerRadius_given)
    write_into_file(outfile, "vacancyInnerRadius", args_info->vacancyInnerRadius_orig, 0);
  if (args_info->vacancyOuterRadius_given)
    write_into_file(outfile, "vacancyOuterRadius", args_info->vacancyOuterRadius_orig, 0);
  

  i = EXIT_SUCCESS;
  return i;
}